

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O1

void __thiscall icu_63::RelativeDateFormat::loadDates(RelativeDateFormat *this,UErrorCode *status)

{
  int32_t iVar1;
  char *localeID;
  UResourceBundle *resB;
  UChar *s1;
  SimpleFormatter *this_00;
  UDateFormatStyle UVar2;
  long lVar3;
  undefined6 *size;
  LocalUResourceBundlePointer dateTimePatterns;
  RelDateFmtDataSink sink;
  LocalPointerBase<UResourceBundle> local_a0;
  ResourceSink local_98;
  URelativeString *local_90;
  int local_88;
  ConstChar16Ptr local_80;
  UChar *local_78;
  UnicodeString local_68;
  
  localeID = Locale::getBaseName(&this->fLocale);
  resB = ures_open_63((char *)0x0,localeID,status);
  local_a0.ptr = ures_getByKeyWithFallback_63
                           (resB,"calendar/gregorian/DateTimePatterns",(UResourceBundle *)0x0,status
                           );
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (iVar1 = ures_getSize_63(local_a0.ptr), 8 < iVar1)) {
    local_98.super_UObject._vptr_UObject =
         (UObject)((ulong)local_98.super_UObject._vptr_UObject & 0xffffffff00000000);
    size = (undefined6 *)0x8;
    if (0xc < iVar1) {
      UVar2 = this->fDateStyle & ~UDAT_FULL_RELATIVE;
      size = (undefined6 *)(ulong)(uint)(UVar2 + 9);
      if (UDAT_SHORT_RELATIVE < UVar2) {
        size = (undefined6 *)0x8;
      }
      if (this->fDateStyle < UDAT_FULL) {
        size = (undefined6 *)0x8;
      }
    }
    s1 = ures_getStringByIndex_63(local_a0.ptr,(int32_t)size,(int32_t *)&local_98,status);
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (2 < (int)local_98.super_UObject._vptr_UObject)) {
      size = &patItem1;
      iVar1 = u_strncmp_63(s1,
                           L"{1}㙎捩彵㌶㠱敒慬楴敶慄整潆浲瑡E㙎捩彵㌶㈱䝟佌䅂彌也ㅟ㠱敒䑬瑡䙥瑭慄慴楓歮E"
                           ,3);
      if (iVar1 == 0) {
        this->fCombinedHasDateAtStart = '\x01';
      }
    }
    this_00 = (SimpleFormatter *)UMemory::operator_new((UMemory *)0x48,(size_t)size);
    if (this_00 == (SimpleFormatter *)0x0) {
      this->fCombinedFormat = (SimpleFormatter *)0x0;
    }
    else {
      local_80.p_ = s1;
      icu_63::UnicodeString::UnicodeString
                (&local_68,'\x01',&local_80,(int)local_98.super_UObject._vptr_UObject);
      SimpleFormatter::SimpleFormatter(this_00,&local_68,2,2,status);
      this->fCombinedFormat = this_00;
      icu_63::UnicodeString::~UnicodeString(&local_68);
      local_78 = local_80.p_;
    }
  }
  this->fDatesLen = 6;
  local_90 = (URelativeString *)uprv_malloc_63(0x60);
  this->fDates = local_90;
  local_88 = this->fDatesLen;
  local_98.super_UObject._vptr_UObject = (UObject)&PTR__ResourceSink_0047fdc0;
  if (0 < (long)local_88) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)&local_90->offset + lVar3) = 0xffffffff00000000;
      *(undefined8 *)((long)&local_90->string + lVar3) = 0;
      lVar3 = lVar3 + 0x10;
    } while ((long)local_88 * 0x10 != lVar3);
  }
  ures_getAllItemsWithFallback_63(resB,"fields/day/relative",&local_98,status);
  ures_close_63(resB);
  if (U_ZERO_ERROR < *status) {
    this->fDatesLen = 0;
  }
  ResourceSink::~ResourceSink(&local_98);
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_a0);
  return;
}

Assistant:

void RelativeDateFormat::loadDates(UErrorCode &status) {
    UResourceBundle *rb = ures_open(NULL, fLocale.getBaseName(), &status);
    LocalUResourceBundlePointer dateTimePatterns(
        ures_getByKeyWithFallback(rb,
                                  "calendar/gregorian/DateTimePatterns",
                                  (UResourceBundle*)NULL, &status));
    if(U_SUCCESS(status)) {
        int32_t patternsSize = ures_getSize(dateTimePatterns.getAlias());
        if (patternsSize > kDateTime) {
            int32_t resStrLen = 0;
            int32_t glueIndex = kDateTime;
            if (patternsSize >= (kDateTimeOffset + kShort + 1)) {
                int32_t offsetIncrement = (fDateStyle & ~kRelative); // Remove relative bit.
                if (offsetIncrement >= (int32_t)kFull &&
                    offsetIncrement <= (int32_t)kShortRelative) {
                    glueIndex = kDateTimeOffset + offsetIncrement;
                }
            }

            const UChar *resStr = ures_getStringByIndex(dateTimePatterns.getAlias(), glueIndex, &resStrLen, &status);
            if (U_SUCCESS(status) && resStrLen >= patItem1Len && u_strncmp(resStr,patItem1,patItem1Len)==0) {
                fCombinedHasDateAtStart = TRUE;
            }
            fCombinedFormat = new SimpleFormatter(UnicodeString(TRUE, resStr, resStrLen), 2, 2, status);
        }
    }

    // Data loading for relative names, e.g., "yesterday", "today", "tomorrow".
    fDatesLen = UDAT_DIRECTION_COUNT; // Maximum defined by data.
    fDates = (URelativeString*) uprv_malloc(sizeof(fDates[0])*fDatesLen);

    RelDateFmtDataSink sink(fDates, fDatesLen);
    ures_getAllItemsWithFallback(rb, "fields/day/relative", sink, status);

    ures_close(rb);

    if(U_FAILURE(status)) {
        fDatesLen=0;
        return;
    }
}